

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::Compiler::get_work_group_size_specialization_constants
          (Compiler *this,SpecializationConstant *x,SpecializationConstant *y,
          SpecializationConstant *z)

{
  SpecializationConstant SVar1;
  SpecializationConstant SVar2;
  ConstantMatrix *pCVar3;
  bool bVar4;
  TypedID<(spirv_cross::Types)3> TVar5;
  uint32_t uVar6;
  TypedID<(spirv_cross::Types)0> local_6c;
  uint32_t local_68;
  uint32_t local_64;
  TypedID<(spirv_cross::Types)0> local_60;
  uint32_t local_5c;
  uint32_t local_58;
  TypedID<(spirv_cross::Types)0> local_54;
  SPIRConstant *local_50;
  SPIRConstant *c;
  TypedID<(spirv_cross::Types)3> local_40;
  undefined4 uStack_3c;
  TypedID<(spirv_cross::Types)3> local_38;
  undefined4 uStack_34;
  SPIREntryPoint *local_30;
  SPIREntryPoint *execution;
  SpecializationConstant *z_local;
  SpecializationConstant *y_local;
  SpecializationConstant *x_local;
  Compiler *this_local;
  
  execution = (SPIREntryPoint *)z;
  z_local = y;
  y_local = x;
  x_local = (SpecializationConstant *)this;
  local_30 = get_entry_point(this);
  TypedID<(spirv_cross::Types)3>::TypedID(&local_38,0);
  uStack_34 = 0;
  SVar2.constant_id = 0;
  SVar2.id.id = local_38.id;
  *y_local = SVar2;
  TypedID<(spirv_cross::Types)3>::TypedID(&local_40,0);
  uStack_3c = 0;
  SVar1.constant_id = 0;
  SVar1.id.id = local_40.id;
  *z_local = SVar1;
  TypedID<(spirv_cross::Types)3>::TypedID((TypedID<(spirv_cross::Types)3> *)&c,0);
  c._4_4_ = 0;
  *(ulong *)execution = (ulong)(uint)c;
  if ((local_30->workgroup_size).constant != 0) {
    local_50 = get<spirv_cross::SPIRConstant>(this,(local_30->workgroup_size).constant);
    pCVar3 = &local_50->m;
    TypedID<(spirv_cross::Types)0>::TypedID(&local_54,0);
    bVar4 = TypedID<(spirv_cross::Types)0>::operator!=(pCVar3->c[0].id,&local_54);
    if (bVar4) {
      local_58 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)(local_50->m).c[0].id);
      (y_local->id).id = local_58;
      local_5c = (local_50->m).c[0].id[0].id;
      uVar6 = get_decoration(this,(ID)local_5c,DecorationSpecId);
      y_local->constant_id = uVar6;
    }
    pCVar3 = &local_50->m;
    TypedID<(spirv_cross::Types)0>::TypedID(&local_60,0);
    bVar4 = TypedID<(spirv_cross::Types)0>::operator!=(pCVar3->c[0].id + 1,&local_60);
    if (bVar4) {
      local_64 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)((local_50->m).c[0].id + 1))
      ;
      (z_local->id).id = local_64;
      local_68 = (local_50->m).c[0].id[1].id;
      uVar6 = get_decoration(this,(ID)local_68,DecorationSpecId);
      z_local->constant_id = uVar6;
    }
    pCVar3 = &local_50->m;
    TypedID<(spirv_cross::Types)0>::TypedID(&local_6c,0);
    bVar4 = TypedID<(spirv_cross::Types)0>::operator!=(pCVar3->c[0].id + 2,&local_6c);
    if (bVar4) {
      TVar5 = TypedID::operator_cast_to_TypedID((TypedID *)((local_50->m).c[0].id + 2));
      (execution->self).id = TVar5.id;
      uVar6 = get_decoration(this,(ID)(local_50->m).c[0].id[2].id,DecorationSpecId);
      *(uint32_t *)&execution->field_0x4 = uVar6;
    }
  }
  return (local_30->workgroup_size).constant;
}

Assistant:

uint32_t Compiler::get_work_group_size_specialization_constants(SpecializationConstant &x, SpecializationConstant &y,
                                                                SpecializationConstant &z) const
{
	auto &execution = get_entry_point();
	x = { 0, 0 };
	y = { 0, 0 };
	z = { 0, 0 };

	if (execution.workgroup_size.constant != 0)
	{
		auto &c = get<SPIRConstant>(execution.workgroup_size.constant);

		if (c.m.c[0].id[0] != ID(0))
		{
			x.id = c.m.c[0].id[0];
			x.constant_id = get_decoration(c.m.c[0].id[0], DecorationSpecId);
		}

		if (c.m.c[0].id[1] != ID(0))
		{
			y.id = c.m.c[0].id[1];
			y.constant_id = get_decoration(c.m.c[0].id[1], DecorationSpecId);
		}

		if (c.m.c[0].id[2] != ID(0))
		{
			z.id = c.m.c[0].id[2];
			z.constant_id = get_decoration(c.m.c[0].id[2], DecorationSpecId);
		}
	}

	return execution.workgroup_size.constant;
}